

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void merge_cache_lcp_2way<false,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  uchar **ppuVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  lcp_t *plVar6;
  tuple<int&,unsigned_long&> local_c0 [16];
  tuple<int,_unsigned_long> local_b0;
  size_t local_a0;
  lcp_t lcp01_1;
  uint local_90;
  int cmp01_1;
  int l_4;
  int l_3;
  tuple<int,_unsigned_long> local_78;
  size_t local_68;
  lcp_t lcp01;
  int cmp01;
  int l_2;
  int l_1;
  int l;
  uint cache1;
  uint cache0;
  lcp_t lcp1;
  lcp_t lcp0;
  lcp_t *lcp_input1_local;
  uchar **from1_local;
  size_t n0_local;
  uint *cache_input0_local;
  lcp_t *lcp_input0_local;
  uchar **from0_local;
  
  lcp0 = (lcp_t)lcp_input1;
  lcp_input1_local = (lcp_t *)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)cache_input0;
  cache_input0_local = (uint *)lcp_input0;
  lcp_input0_local = (lcp_t *)from0;
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_int>((uchar **)lcp_input1_local,(lcp_t *)lcp0,cache_input1,n1);
  lcp1 = 0;
  _cache1 = 0;
  l = *(int *)n0_local;
  puVar5 = cache_input1 + 1;
  l_1 = *cache_input1;
  n0_local = n0_local + 4;
  stat_try_cache();
  if ((uint)l < (uint)l_1) {
    iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    l_2 = lcp(l,l_1);
    if (0 < l_2) {
      l_1 = get_char<unsigned_int>((uchar *)*lcp_input1_local,(long)l_2);
    }
    *result = (uchar *)*lcp_input0_local;
    lcp1 = *(lcp_t *)cache_input0_local;
    _cache1 = (size_t)l_2;
    l = *(int *)n0_local;
    lcp_input0_local = lcp_input0_local + 1;
    cache_input0_local = cache_input0_local + 2;
    n0_local = n0_local + 4;
  }
  else {
    if ((uint)l_1 < (uint)l) {
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      cmp01 = lcp(l,l_1);
      if (0 < cmp01) {
        l = get_char<unsigned_int>((uchar *)*lcp_input0_local,(long)cmp01);
      }
      *result = (uchar *)*lcp_input1_local;
      lcp1 = (lcp_t)cmp01;
      _cache1 = *(size_t *)lcp0;
      l_1 = *puVar5;
      lcp_input1_local = lcp_input1_local + 1;
      lcp0 = lcp0 + 8;
joined_r0x0028688e:
      n1 = n1 - 1;
      cache_input1 = cache_input1 + 2;
      ppuVar1 = result + 1;
      if (n1 == 0) {
LAB_002871f5:
        result = ppuVar1;
        if (from1_local != (uchar **)0x0) {
          std::copy<unsigned_char**,unsigned_char**>
                    ((uchar **)lcp_input0_local,(uchar **)(lcp_input0_local + (long)from1_local),
                     result);
          return;
        }
        __assert_fail("n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x527,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      goto LAB_00286b42;
    }
    bVar2 = is_end<unsigned_int>(l);
    if (bVar2) {
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      lcp01._4_4_ = lcp(l,l_1);
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      local_68 = (size_t)(int)lcp01._4_4_;
      l = *(int *)n0_local;
    }
    else {
      stat_cache_useless();
      compare((uchar *)&local_78,(uchar *)*lcp_input0_local,*lcp_input1_local);
      std::tie<int,unsigned_long>(&l_4,&lcp01);
      std::tuple<int&,unsigned_long&>::operator=((tuple<int&,unsigned_long&> *)&l_4,&local_78);
      if ((int)lcp01 < 0) {
        *result = (uchar *)*lcp_input0_local;
        lcp1 = *(lcp_t *)cache_input0_local;
        _cache1 = local_68;
        l = *(int *)n0_local;
        n0_local = n0_local + 4;
        cache_input0_local = cache_input0_local + 2;
        lcp_input0_local = lcp_input0_local + 1;
        l_1 = get_char<unsigned_int>((uchar *)*lcp_input1_local,local_68);
        goto joined_r0x0028695f;
      }
      if ((int)lcp01 != 0) {
        *result = (uchar *)*lcp_input1_local;
        lcp1 = local_68;
        _cache1 = *(size_t *)lcp0;
        lcp0 = lcp0 + 8;
        lcp_input1_local = lcp_input1_local + 1;
        l = get_char<unsigned_int>((uchar *)*lcp_input0_local,local_68);
        l_1 = *puVar5;
        goto joined_r0x0028688e;
      }
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      l = *(int *)n0_local;
    }
    l_1 = 0;
    lcp_input0_local = lcp_input0_local + 1;
    cache_input0_local = cache_input0_local + 2;
    _cache1 = local_68;
    n0_local = n0_local + 4;
  }
joined_r0x0028695f:
  from1_local = (uchar **)((long)from1_local + -1);
  cache_input1 = puVar5;
  ppuVar1 = result + 1;
  if (from1_local == (uchar **)0x0) {
LAB_00287187:
    result = ppuVar1;
    from1_local = (uchar **)0x0;
    if (n1 != 0) {
      std::copy<unsigned_char**,unsigned_char**>
                ((uchar **)lcp_input1_local,(uchar **)(lcp_input1_local + n1),result);
      return;
    }
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
LAB_00286b42:
  result = result + 1;
  do {
    check_lcp_and_cache<unsigned_int>
              (result[-1],(uchar *)*lcp_input0_local,lcp1,l,(uchar *)*lcp_input1_local,_cache1,l_1);
    if (_cache1 < lcp1) {
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (-1 < iVar3) {
        __assert_fail("cmp(*from0, *from1) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4ae,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      *result = (uchar *)*lcp_input0_local;
      lcp1 = *(lcp_t *)cache_input0_local;
      l = *(int *)n0_local;
      n0_local = n0_local + 4;
      cache_input0_local = cache_input0_local + 2;
      lcp_input0_local = lcp_input0_local + 1;
joined_r0x00286f71:
      from1_local = (uchar **)((long)from1_local + -1);
      ppuVar1 = result + 1;
      if (from1_local == (uchar **)0x0) goto LAB_00287187;
    }
    else {
      if (_cache1 <= lcp1) {
        stat_try_cache();
        if ((uint)l < (uint)l_1) {
          iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
          if (-1 < iVar3) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          cmp01_1 = lcp(l,l_1);
          if (0 < cmp01_1) {
            _cache1 = (long)cmp01_1 + _cache1;
            l_1 = get_char<unsigned_int>((uchar *)*lcp_input1_local,_cache1);
          }
          *result = (uchar *)*lcp_input0_local;
          lcp1 = *(lcp_t *)cache_input0_local;
          l = *(int *)n0_local;
          n0_local = n0_local + 4;
          cache_input0_local = cache_input0_local + 2;
          lcp_input0_local = lcp_input0_local + 1;
        }
        else {
          if ((uint)l_1 < (uint)l) {
            iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
            if (iVar3 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                           );
            }
            local_90 = lcp(l,l_1);
            if (0 < (int)local_90) {
              lcp1 = (long)(int)local_90 + lcp1;
              l = get_char<unsigned_int>((uchar *)*lcp_input0_local,lcp1);
            }
            *result = (uchar *)*lcp_input1_local;
            _cache1 = *(size_t *)lcp0;
            l_1 = *cache_input1;
            lcp0 = lcp0 + 8;
            lcp_input1_local = lcp_input1_local + 1;
            goto joined_r0x0028716d;
          }
          bVar2 = is_end<unsigned_int>(l);
          if (bVar2) {
            iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
            if (iVar3 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                           );
            }
            *result = (uchar *)*lcp_input0_local;
            lcp1 = *(lcp_t *)cache_input0_local;
            cache_input0_local = cache_input0_local + 2;
            lcp_input0_local = lcp_input0_local + 1;
            uVar4 = lcp(l,l_1);
            l = *(int *)n0_local;
            _cache1 = uVar4 + _cache1;
            puVar5 = cache_input0_local;
            plVar6 = lcp_input0_local;
          }
          else {
            stat_cache_useless();
            compare((uchar *)&local_b0,(uchar *)*lcp_input0_local,*lcp_input1_local);
            std::tie<int,unsigned_long>((int *)local_c0,(unsigned_long *)((long)&lcp01_1 + 4));
            std::tuple<int&,unsigned_long&>::operator=(local_c0,&local_b0);
            if (lcp01_1._4_4_ < 0) {
              *result = (uchar *)*lcp_input0_local;
              lcp1 = *(lcp_t *)cache_input0_local;
              _cache1 = local_a0;
              l = *(int *)n0_local;
              n0_local = n0_local + 4;
              cache_input0_local = cache_input0_local + 2;
              lcp_input0_local = lcp_input0_local + 1;
              l_1 = get_char<unsigned_int>((uchar *)*lcp_input1_local,local_a0);
              goto joined_r0x00286f71;
            }
            if (lcp01_1._4_4_ != 0) {
              *result = (uchar *)*lcp_input1_local;
              lcp1 = local_a0;
              _cache1 = *(size_t *)lcp0;
              lcp0 = lcp0 + 8;
              lcp_input1_local = lcp_input1_local + 1;
              l = get_char<unsigned_int>((uchar *)*lcp_input0_local,local_a0);
              l_1 = *cache_input1;
              goto joined_r0x0028716d;
            }
            plVar6 = lcp_input0_local + 1;
            *result = (uchar *)*lcp_input0_local;
            puVar5 = cache_input0_local + 2;
            lcp1 = *(lcp_t *)cache_input0_local;
            l = *(int *)n0_local;
            _cache1 = local_a0;
          }
          l_1 = 0;
          n0_local = n0_local + 4;
          cache_input0_local = puVar5;
          lcp_input0_local = plVar6;
        }
        goto joined_r0x00286f71;
      }
      iVar3 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      *result = (uchar *)*lcp_input1_local;
      _cache1 = *(size_t *)lcp0;
      l_1 = *cache_input1;
      lcp0 = lcp0 + 8;
      lcp_input1_local = lcp_input1_local + 1;
joined_r0x0028716d:
      n1 = n1 - 1;
      cache_input1 = cache_input1 + 1;
      ppuVar1 = result + 1;
      if (n1 == 0) goto LAB_002871f5;
    }
    result = result + 1;
  } while( true );
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}